

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# imgui.cpp
# Opt level: O3

void ImGui::PopStyleColor(int count)

{
  ImVec4 *pIVar1;
  ImVec4 *pIVar2;
  ImGuiColorMod *pIVar3;
  float fVar4;
  float fVar5;
  float fVar6;
  ImGuiContext *pIVar7;
  int iVar8;
  uint uVar9;
  
  pIVar7 = GImGui;
  if (0 < count) {
    iVar8 = (GImGui->ColorStack).Size;
    uVar9 = count + 1;
    do {
      pIVar3 = (pIVar7->ColorStack).Data;
      pIVar2 = &pIVar3[(long)iVar8 + -1].BackupValue;
      fVar4 = pIVar2->y;
      fVar5 = pIVar2->z;
      fVar6 = pIVar2->w;
      pIVar1 = (pIVar7->Style).Colors + pIVar3[(long)iVar8 + -1].Col;
      pIVar1->x = pIVar2->x;
      pIVar1->y = fVar4;
      pIVar1->z = fVar5;
      pIVar1->w = fVar6;
      iVar8 = (pIVar7->ColorStack).Size + -1;
      (pIVar7->ColorStack).Size = iVar8;
      uVar9 = uVar9 - 1;
    } while (1 < uVar9);
  }
  return;
}

Assistant:

void ImGui::PopStyleColor(int count)
{
    ImGuiContext& g = *GImGui;
    while (count > 0)
    {
        ImGuiColorMod& backup = g.ColorStack.back();
        g.Style.Colors[backup.Col] = backup.BackupValue;
        g.ColorStack.pop_back();
        count--;
    }
}